

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupWindow::destroyIfSingleItemLeft(QDockWidgetGroupWindow *this)

{
  byte bVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  QDockAreaLayoutInfo *this_00;
  QDockWidgetGroupWindow *in_RDI;
  long in_FS_OFFSET;
  DragScope in_stack_0000001c;
  QMainWindowLayout *mwLayout;
  QMainWindow *mainWindow;
  QDockWidget *lastDockWidget;
  QList<QDockWidget_*> *dockWidgets;
  qsizetype in_stack_ffffffffffffff78;
  QList<QDockWidget_*> *in_stack_ffffffffffffff80;
  QDockWidget *this_01;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QDockAreaLayoutInfo *this_02;
  QDockWidgetGroupWindow *this_03;
  QDockWidgetGroupWindow *in_stack_ffffffffffffffd8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = in_RDI;
  QDockWidgetGroupWindow::dockWidgets
            ((QDockWidgetGroupWindow *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
            );
  this_02 = (QDockAreaLayoutInfo *)&stack0xffffffffffffffe0;
  qVar2 = QList<QDockWidget_*>::count((QList<QDockWidget_*> *)0x5f2398);
  if (qVar2 == 1) {
    ppQVar3 = QList<QDockWidget_*>::at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_01 = *ppQVar3;
    layoutInfo((QDockWidgetGroupWindow *)0x5f23cb);
    QDockAreaLayoutInfo::indexOf
              (this_02,(QWidget *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    bVar1 = QList<int>::isEmpty((QList<int> *)0x5f23e7);
    QList<int>::~QList((QList<int> *)0x5f23f5);
    if ((bVar1 & 1) == 0) {
      this_00 = (QDockAreaLayoutInfo *)QWidget::parentWidget((QWidget *)0x5f2416);
      qt_mainwindow_layout((QMainWindow *)0x5f2425);
      QMainWindowLayout::unplug
                ((QMainWindowLayout *)mainWindow,(QWidget *)mwLayout,in_stack_0000001c);
      QWidget::geometry(&in_RDI->super_QWidget);
      QWidget::setGeometry
                ((QWidget *)this_02,
                 (QRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      QWidget::hide((QWidget *)0x5f2469);
      reparentToMainWindow(this_03,(QDockWidget *)this_02);
      layoutInfo((QDockWidgetGroupWindow *)0x5f2482);
      QDockAreaLayoutInfo::deleteAllLayoutItems(this_00);
      layoutInfo((QDockWidgetGroupWindow *)0x5f2494);
      QList<QDockAreaLayoutItem>::clear((QList<QDockAreaLayoutItem> *)this_01);
      destroyOrHideIfEmpty(in_stack_ffffffffffffffd8);
    }
  }
  QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5f24bc);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidgetGroupWindow::destroyIfSingleItemLeft()
{
    const auto &dockWidgets = this->dockWidgets();

    // Handle only the last dock
    if (dockWidgets.count() != 1)
        return;

    auto *lastDockWidget = dockWidgets.at(0);

    // If the last remaining dock widget is not in the group window's item_list,
    // a group window is being docked on a main window docking area.
    // => don't interfere
    if (layoutInfo()->indexOf(lastDockWidget).isEmpty())
        return;

    Q_ASSERT(qobject_cast<QMainWindow *>(parentWidget()));
    auto *mainWindow = static_cast<QMainWindow *>(parentWidget());
    QMainWindowLayout *mwLayout = qt_mainwindow_layout(mainWindow);

    // Unplug the last remaining dock widget and hide the group window, to avoid flickering
    mwLayout->unplug(lastDockWidget, QDockWidgetPrivate::DragScope::Widget);
    lastDockWidget->setGeometry(geometry());
    hide();

    // Re-parent last dock widget
    reparentToMainWindow(lastDockWidget);

    // the group window could still have placeholder items => clear everything
    layoutInfo()->deleteAllLayoutItems();
    layoutInfo()->item_list.clear();

    destroyOrHideIfEmpty();
}